

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.hpp
# Opt level: O2

pair<const_pstore::index::details::index_pointer,_unsigned_long> __thiscall
pstore::index::details::linear_node::
lookup<pstore::indirect_string,pstore::indirect_string,std::equal_to<pstore::indirect_string>,void>
          (linear_node *this,undefined8 db,indirect_string *key)

{
  bool bVar1;
  index_pointer iVar2;
  indirect_string *archive;
  indirect_string *extraout_RDX;
  unsigned_long uVar3;
  linear_node *__range3;
  long lVar4;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> pVar5;
  undefined8 local_58;
  value_type local_50;
  indirect_string existing_key;
  
  lVar4 = this->size_ << 3;
  uVar3 = 0;
  archive = key;
  do {
    if (lVar4 == 0) {
      iVar2.internal_ = (internal_node *)0x0;
      uVar3 = 0xffffffffffffffff;
LAB_00128c93:
      pVar5.second = uVar3;
      pVar5.first.internal_ = iVar2.internal_;
      return pVar5;
    }
    local_50 = this->leaves_[uVar3].a_;
    local_58 = db;
    serialize::read<pstore::indirect_string,pstore::serialize::archive::database_reader>
              (&existing_key,(serialize *)&local_58,(database_reader *)archive);
    bVar1 = indirect_string::operator==(&existing_key,key);
    if (bVar1) {
      iVar2 = (index_pointer)((index_pointer *)(this->leaves_ + uVar3))->internal_;
      goto LAB_00128c93;
    }
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + -8;
    archive = extraout_RDX;
  } while( true );
}

Assistant:

auto linear_node::lookup (database const & db, OtherKeyType const & key,
                                      KeyEqual equal) const
                -> std::pair<index_pointer const, std::size_t> {
                // Linear search. TODO: perhaps we should sort the nodes and use a binary
                // search? This would require a template compare method.
                std::size_t cnum = 0;
                for (auto const & child : *this) {
                    KeyType const existing_key =
                        serialize::read<KeyType> (serialize::archive::database_reader{db, child});
                    if (equal (existing_key, key)) {
                        return {index_pointer{child}, cnum};
                    }
                    ++cnum;
                }
                // Not found
                return {index_pointer (), details::not_found};
            }